

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiver.cpp
# Opt level: O3

void __thiscall
MyClientConnection::OnData(MyClientConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  ostringstream *poVar1;
  char *__s;
  long lVar2;
  TonkFile pTVar3;
  uint64_t uVar4;
  size_t sVar5;
  uint64_t uVar6;
  OutputWorker *pOVar7;
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [64];
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar10 [16];
  undefined8 extraout_XMM1_Qb_01;
  undefined1 auVar11 [16];
  uint8_t ping_message [9];
  undefined1 local_238 [392];
  TonkStatusEx local_b0;
  undefined1 extraout_var [56];
  undefined1 auVar9 [16];
  undefined8 extraout_XMM1_Qb_00;
  
  auVar11 = in_ZMM0._0_16_;
  if (channel == 0x96) {
    pTVar3 = tonk_file_receive(this->File,data,bytes,OnData::anon_class_1_0_00000001::__invoke,this)
    ;
    this->File = pTVar3;
    uVar4 = tonk_time();
    pTVar3 = this->File;
    if ((pTVar3 != (TonkFile)0x0) && (1000000 < uVar4 - this->LastReportUsec)) {
      this->LastReportUsec = uVar4;
      auVar11 = vcvtusi2ss_avx512f(auVar11,pTVar3->TotalBytes);
      uVar6 = pTVar3->ProgressBytes;
      tonk::SDKConnection::GetStatusEx(&local_b0,&this->super_SDKConnection);
      if ((int)Logger.ChannelMinLevel < 3) {
        auVar10 = vcvtusi2sd_avx512f(in_XMM1,local_b0.IncomingBPS);
        poVar1 = (ostringstream *)(local_238 + 0x10);
        local_238[0] = SUB81(Logger.ChannelName,0);
        local_238._1_7_ = (undefined7)((ulong)Logger.ChannelName >> 8);
        local_238._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        auVar9._8_8_ = extraout_XMM1_Qb;
        auVar9._0_8_ = extraout_XMM1_Qa;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"File(",5);
        __s = pTVar3->Name;
        if (__s == (char *)0x0) {
          std::ios::clear((int)poVar1 + (int)*(undefined8 *)(local_238._16_8_ + -0x18));
          auVar9._8_8_ = extraout_XMM1_Qb_01;
          auVar9._0_8_ = extraout_XMM1_Qa_00;
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar5);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,") progress: ",0xc);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," / ",3);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," Bytes (",8);
        auVar9 = vcvtusi2ss_avx512f(auVar9,uVar6 * 100);
        std::ostream::_M_insert<double>((double)(auVar9._0_4_ / auVar11._0_4_));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"%).  Incoming at ",0x11);
        std::ostream::_M_insert<double>(auVar10._0_8_ / 1000.0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," KBPS",5);
        pOVar7 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_238);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_238 + 0x80));
      }
      local_238[0] = 0x4d;
      local_238._1_7_ = (undefined7)uVar4;
      local_238[8] = (undefined1)(uVar4 >> 0x38);
      tonk::SDKConnection::Send(&this->super_SDKConnection,local_238,9,0x33);
    }
  }
  else if (bytes == 0xc && channel == 0x33) {
    lVar2 = *(long *)(data + 1);
    uVar4 = tonk_time();
    uVar6 = tonk::SDKConnection::FromLocalTime23
                      (&this->super_SDKConnection,(uint)*(uint3 *)(data + 9));
    if ((int)Logger.ChannelMinLevel < 3) {
      poVar1 = (ostringstream *)(local_238 + 0x10);
      local_238[0] = SUB81(Logger.ChannelName,0);
      local_238._1_7_ = (undefined7)((ulong)Logger.ChannelName >> 8);
      local_238._8_4_ = Info;
      auVar11 = std::__cxx11::ostringstream::ostringstream(poVar1);
      auVar10._0_8_ = auVar11._8_8_;
      auVar8._0_8_ = auVar11._0_8_;
      auVar10._8_8_ = extraout_XMM1_Qb_00;
      auVar8._8_56_ = extraout_var;
      auVar11 = auVar8._0_16_;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Low-latency ping RTT = ",0x17);
      auVar11 = vcvtusi2ss_avx512f(auVar11,uVar4 - lVar2);
      std::ostream::_M_insert<double>((double)(auVar11._0_4_ / 1000.0));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," ms, OWD(remote2local) = ",0x19);
      auVar11 = vcvtusi2ss_avx512f(auVar10,uVar4 - uVar6);
      std::ostream::_M_insert<double>((double)(auVar11._0_4_ / 1000.0));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," ms",3);
      pOVar7 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar7,(LogStringBuffer *)local_238);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_238 + 0x80));
    }
  }
  return;
}

Assistant:

void MyClientConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_LowPri0)
    {
        File = tonk_file_receive(
            File,
            data,
            bytes,
            [](TonkFile file, void* context) -> int
        {
            MyClientConnection* thiz = reinterpret_cast<MyClientConnection*>(context);

            return thiz->OnFileDone(file);
        }, this);

        const uint64_t nowUsec = tonk_time();
        if (File && nowUsec - LastReportUsec > 1000000)
        {
            LastReportUsec = nowUsec;
            Logger.Info("File(", File->Name, ") progress: ", File->ProgressBytes, " / ", File->TotalBytes,
                " Bytes (", File->ProgressBytes * 100 / (float)File->TotalBytes,
                "%).  Incoming at ", GetStatusEx().IncomingBPS / 1000.0, " KBPS");

            // Periodically send a ping to demonstrate that data is still low-latency
            uint8_t ping_message[1 + 8];
            ping_message[0] = 77;
            tonk::WriteU64_LE(ping_message + 1, nowUsec);
            Send(ping_message, 9, TonkChannel_Reliable1);
        }
    }
    else if (channel == TonkChannel_Reliable1 && bytes == 1 + 8 + 3)
    {
        uint64_t pingUsec = tonk::ReadU64_LE(data + 1);
        uint64_t pongUsec = tonk_time();

        uint32_t compressedRemoteUsec = tonk::ReadU24_LE(data + 1 + 8);
        uint64_t remoteUsec = FromLocalTime23(compressedRemoteUsec);

        Logger.Info("Low-latency ping RTT = ", (pongUsec - pingUsec) / 1000.f, " ms, OWD(remote2local) = ", (pongUsec - remoteUsec) / 1000.f, " ms");
    }
}